

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doc_comment_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::anon_unknown_0::JavaDocCommentTest_Escaping_Test::TestBody
          (JavaDocCommentTest_Escaping_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_RCX;
  char *pcVar3;
  string_view input;
  string_view input_00;
  string_view input_01;
  string_view input_02;
  string_view input_03;
  string_view input_04;
  AssertHelper local_200;
  Message local_1f8;
  basic_string_view<char,_std::char_traits<char>_> local_1f0;
  string local_1e0;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_5;
  Message local_1a8;
  basic_string_view<char,_std::char_traits<char>_> local_1a0;
  string local_190;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_4;
  Message local_158;
  basic_string_view<char,_std::char_traits<char>_> local_150;
  string local_140;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_3;
  Message local_108;
  basic_string_view<char,_std::char_traits<char>_> local_100;
  string local_f0;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_2;
  Message local_b8;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  string local_a0;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  Message local_68 [3];
  basic_string_view<char,_std::char_traits<char>_> local_50;
  string local_40;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  JavaDocCommentTest_Escaping_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_50,"foo /* bar */ baz");
  input._M_str = in_RCX;
  input._M_len = (size_t)local_50._M_str;
  EscapeJavadoc_abi_cxx11_(&local_40,(java *)local_50._M_len,input);
  pcVar3 = "foo /&#42; bar *&#47; baz";
  testing::internal::EqHelper::
  Compare<char[26],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_20,"\"foo /&#42; bar *&#47; baz\"",
             "EscapeJavadoc(\"foo /* bar */ baz\")",(char (*) [26])"foo /&#42; bar *&#47; baz",
             &local_40);
  std::__cxx11::string::~string((string *)&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    pcVar3 = (char *)0x15;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/doc_comment_unittest.cc"
               ,0x15,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b0,"foo /*/ baz");
  input_00._M_str = pcVar3;
  input_00._M_len = (size_t)local_b0._M_str;
  EscapeJavadoc_abi_cxx11_(&local_a0,(java *)local_b0._M_len,input_00);
  pcVar3 = "foo /&#42;&#47; baz";
  testing::internal::EqHelper::
  Compare<char[20],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_80,"\"foo /&#42;&#47; baz\"","EscapeJavadoc(\"foo /*/ baz\")",
             (char (*) [20])"foo /&#42;&#47; baz",&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    pcVar3 = (char *)0x16;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/doc_comment_unittest.cc"
               ,0x16,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_100,"{@foo}");
  input_01._M_str = pcVar3;
  input_01._M_len = (size_t)local_100._M_str;
  EscapeJavadoc_abi_cxx11_(&local_f0,(java *)local_100._M_len,input_01);
  pcVar3 = "{&#64;foo}";
  testing::internal::EqHelper::
  Compare<char[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_d0,"\"{&#64;foo}\"","EscapeJavadoc(\"{@foo}\")",
             (char (*) [11])"{&#64;foo}",&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    pcVar3 = (char *)0x17;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/doc_comment_unittest.cc"
               ,0x17,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_150,"<i>&</i>");
  input_02._M_str = pcVar3;
  input_02._M_len = (size_t)local_150._M_str;
  EscapeJavadoc_abi_cxx11_(&local_140,(java *)local_150._M_len,input_02);
  pcVar3 = "&lt;i&gt;&amp;&lt;/i&gt;";
  testing::internal::EqHelper::
  Compare<char[25],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_120,"\"&lt;i&gt;&amp;&lt;/i&gt;\"","EscapeJavadoc(\"<i>&</i>\")",
             (char (*) [25])"&lt;i&gt;&amp;&lt;/i&gt;",&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    pcVar3 = (char *)0x18;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/doc_comment_unittest.cc"
               ,0x18,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1a0,"foo\\u1234bar");
  input_03._M_str = pcVar3;
  input_03._M_len = (size_t)local_1a0._M_str;
  EscapeJavadoc_abi_cxx11_(&local_190,(java *)local_1a0._M_len,input_03);
  pcVar3 = "foo&#92;u1234bar";
  testing::internal::EqHelper::
  Compare<char[17],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_170,"\"foo&#92;u1234bar\"","EscapeJavadoc(\"foo\\\\u1234bar\")",
             (char (*) [17])"foo&#92;u1234bar",&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    pcVar3 = (char *)0x19;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/doc_comment_unittest.cc"
               ,0x19,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1f0,"@deprecated")
  ;
  input_04._M_str = pcVar3;
  input_04._M_len = (size_t)local_1f0._M_str;
  EscapeJavadoc_abi_cxx11_(&local_1e0,(java *)local_1f0._M_len,input_04);
  testing::internal::EqHelper::
  Compare<char[16],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_1c0,"\"&#64;deprecated\"","EscapeJavadoc(\"@deprecated\")",
             (char (*) [16])"&#64;deprecated",&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/doc_comment_unittest.cc"
               ,0x1a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  return;
}

Assistant:

TEST(JavaDocCommentTest, Escaping) {
  EXPECT_EQ("foo /&#42; bar *&#47; baz", EscapeJavadoc("foo /* bar */ baz"));
  EXPECT_EQ("foo /&#42;&#47; baz", EscapeJavadoc("foo /*/ baz"));
  EXPECT_EQ("{&#64;foo}", EscapeJavadoc("{@foo}"));
  EXPECT_EQ("&lt;i&gt;&amp;&lt;/i&gt;", EscapeJavadoc("<i>&</i>"));
  EXPECT_EQ("foo&#92;u1234bar", EscapeJavadoc("foo\\u1234bar"));
  EXPECT_EQ("&#64;deprecated", EscapeJavadoc("@deprecated"));
}